

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O2

string * __thiscall
flatbuffers::FlatBufMethod::get_output_type_name_abi_cxx11_
          (string *__return_storage_ptr__,FlatBufMethod *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->method_->response);
  return __return_storage_ptr__;
}

Assistant:

std::string get_output_type_name() const { return (*method_->response).name; }